

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  CommentInfo *pCVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  pCVar1 = root->comments_;
  if (pCVar1 != (CommentInfo *)0x0) {
    if (pCVar1[1].comment_ != (char *)0x0) {
      Value::getComment_abi_cxx11_(&local_38,root,commentAfterOnSameLine);
      normalizeEOL(&local_58,&local_38);
      std::operator+(&bStack_78," ",&local_58);
      std::__cxx11::string::append((string *)&this->document_);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      pCVar1 = root->comments_;
      if (pCVar1 == (CommentInfo *)0x0) {
        return;
      }
    }
    if (pCVar1[2].comment_ != (char *)0x0) {
      psVar2 = &this->document_;
      std::__cxx11::string::append((char *)psVar2);
      Value::getComment_abi_cxx11_(&local_58,root,commentAfter);
      normalizeEOL(&bStack_78,&local_58);
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::append((char *)psVar2);
    }
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}